

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

void EvaluateNode(size_t block_start,size_t pos,size_t max_backward_limit,size_t gap,
                 int *starting_dist_cache,ZopfliCostModel *model,StartPosQueue *queue,
                 ZopfliNode *nodes)

{
  size_t *psVar1;
  float *pfVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  undefined8 *puVar19;
  int *piVar20;
  uint uVar21;
  float fVar22;
  int local_58 [2];
  size_t sStack_50;
  PosData posdata;
  
  piVar20 = queue->q_[0].distance_cache + pos * 4 + 1;
  posdata.distance_cache[1] = *piVar20;
  if (pos == 0) {
    uVar12 = 0;
  }
  else {
    uVar11 = queue->q_[0].distance_cache[pos * 4 + -1];
    uVar21 = queue->q_[0].distance_cache[pos * 4 + -2] & 0x1ffffff;
    uVar3 = queue->q_[0].distance_cache[pos * 4];
    if ((uVar11 <= max_backward_limit) && ((ulong)uVar11 + (ulong)uVar21 <= block_start + pos)) {
      iVar13 = (uVar3 >> 0x1b) - 1;
      if (uVar3 < 0x8000000) {
        iVar13 = uVar11 + 0xf;
      }
      if (iVar13 != 0) {
        uVar12 = pos & 0xffffffff;
        goto LAB_001178f3;
      }
    }
    uVar12 = (ulong)*(uint *)((long)queue + (pos - ((uVar3 & 0x7ffffff) + uVar21)) * 0x10 + 0xc);
  }
LAB_001178f3:
  *piVar20 = (int)(float)uVar12;
  fVar22 = (*(float **)(starting_dist_cache + 0x2c4))[pos] -
           **(float **)(starting_dist_cache + 0x2c4);
  if ((float)posdata.distance_cache[1] <= fVar22) {
    posdata.distance_cache[0] = (int)((float)posdata.distance_cache[1] - fVar22);
    lVar14 = 2;
    for (; (lVar14 - 2U < 4 && ((int)uVar12 != 0));
        uVar12 = (ulong)*(uint *)((long)queue +
                                 (uVar12 - ((uVar3 & 0x1ffffff) + (uVar11 & 0x7ffffff))) * 0x10 +
                                 0xc)) {
      uVar11 = queue->q_[0].distance_cache[uVar12 * 4];
      uVar3 = queue->q_[0].distance_cache[uVar12 * 4 + -2];
      local_58[lVar14] = queue->q_[0].distance_cache[uVar12 * 4 + -1];
      lVar14 = lVar14 + 1;
    }
    for (; lVar14 != 6; lVar14 = lVar14 + 1) {
      iVar13 = *(int *)gap;
      gap = gap + 4;
      local_58[lVar14] = iVar13;
    }
    uVar15 = *(long *)(model->cost_cmd_ + 0x40) + 1;
    uVar11 = ~(uint)*(long *)(model->cost_cmd_ + 0x40) & 7;
    uVar12 = 8;
    if (uVar15 < 8) {
      uVar12 = uVar15;
    }
    *(ulong *)(model->cost_cmd_ + 0x40) = uVar15;
    psVar1 = (size_t *)((long)model->cost_cmd_ + (ulong)(uVar11 << 5) + 0x10);
    *psVar1 = posdata.pos;
    psVar1[1] = CONCAT44(posdata.distance_cache[1],posdata.distance_cache[0]);
    psVar1 = (size_t *)((long)model->cost_cmd_ + (ulong)(uVar11 << 5));
    *psVar1 = pos;
    psVar1[1] = sStack_50;
    for (uVar15 = 1; uVar15 < uVar12; uVar15 = uVar15 + 1) {
      uVar16 = (ulong)(((uVar11 + (int)uVar15) - 1 & 7) << 5);
      fVar22 = *(float *)((long)model->cost_cmd_ + uVar16 + 0x18);
      uVar18 = (ulong)((uVar11 + (int)uVar15 & 7) << 5);
      pfVar2 = (float *)((long)model->cost_cmd_ + uVar18 + 0x18);
      if (*pfVar2 <= fVar22 && fVar22 != *pfVar2) {
        puVar17 = (undefined8 *)((long)model->cost_cmd_ + uVar16);
        puVar19 = (undefined8 *)((long)model->cost_cmd_ + uVar18);
        uVar4 = *puVar17;
        uVar5 = puVar17[1];
        uVar6 = puVar17[2];
        uVar7 = puVar17[3];
        uVar8 = *puVar19;
        uVar9 = puVar19[1];
        uVar10 = puVar19[3];
        puVar17[2] = puVar19[2];
        puVar17[3] = uVar10;
        *puVar17 = uVar8;
        puVar17[1] = uVar9;
        puVar19[2] = uVar6;
        puVar19[3] = uVar7;
        *puVar19 = uVar4;
        puVar19[1] = uVar5;
      }
    }
  }
  return;
}

Assistant:

static void EvaluateNode(
    const size_t block_start, const size_t pos, const size_t max_backward_limit,
    const size_t gap, const int* starting_dist_cache,
    const ZopfliCostModel* model, StartPosQueue* queue, ZopfliNode* nodes) {
  /* Save cost, because ComputeDistanceCache invalidates it. */
  float node_cost = nodes[pos].u.cost;
  nodes[pos].u.shortcut = ComputeDistanceShortcut(
      block_start, pos, max_backward_limit, gap, nodes);
  if (node_cost <= ZopfliCostModelGetLiteralCosts(model, 0, pos)) {
    PosData posdata;
    posdata.pos = pos;
    posdata.cost = node_cost;
    posdata.costdiff = node_cost -
        ZopfliCostModelGetLiteralCosts(model, 0, pos);
    ComputeDistanceCache(
        pos, starting_dist_cache, nodes, posdata.distance_cache);
    StartPosQueuePush(queue, &posdata);
  }
}